

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

int basic_type_size(basic_type bt)

{
  int local_c;
  basic_type bt_local;
  
  switch(bt) {
  case TP_VOID:
    local_c = 1;
    break;
  case TP_BOOL:
    local_c = 1;
    break;
  case TP_CHAR:
    local_c = 1;
    break;
  case TP_SCHAR:
    local_c = 1;
    break;
  case TP_UCHAR:
    local_c = 1;
    break;
  case TP_SHORT:
    local_c = 2;
    break;
  case TP_USHORT:
    local_c = 2;
    break;
  case TP_INT:
    local_c = 4;
    break;
  case TP_UINT:
    local_c = 4;
    break;
  case TP_LONG:
    local_c = 8;
    break;
  case TP_ULONG:
    local_c = 8;
    break;
  case TP_LLONG:
    local_c = 8;
    break;
  case TP_ULLONG:
    local_c = 8;
    break;
  case TP_FLOAT:
    local_c = 4;
    break;
  case TP_DOUBLE:
    local_c = 8;
    break;
  case TP_LDOUBLE:
    local_c = 0x10;
    break;
  default:
    abort();
  }
  return local_c;
}

Assistant:

static int basic_type_size (enum basic_type bt) {
  switch (bt) {
  case TP_BOOL: return sizeof (mir_bool);
  case TP_CHAR: return sizeof (mir_char);
  case TP_SCHAR: return sizeof (mir_schar);
  case TP_UCHAR: return sizeof (mir_uchar);
  case TP_SHORT: return sizeof (mir_short);
  case TP_USHORT: return sizeof (mir_ushort);
  case TP_INT: return sizeof (mir_int);
  case TP_UINT: return sizeof (mir_uint);
  case TP_LONG: return sizeof (mir_long);
  case TP_ULONG: return sizeof (mir_ulong);
  case TP_LLONG: return sizeof (mir_llong);
  case TP_ULLONG: return sizeof (mir_ullong);
  case TP_FLOAT: return sizeof (mir_float);
  case TP_DOUBLE: return sizeof (mir_double);
  case TP_LDOUBLE: return sizeof (mir_ldouble);
  case TP_VOID: return 1;  // ???
  default: abort ();
  }
}